

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkPrintDistribStat(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  Cba_Man_t *pCVar4;
  long lVar5;
  ulong uVar6;
  
  lVar2 = (long)(p->vObjType).nSize;
  if (lVar2 < 1) {
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = (ulong)((int)uVar6 + (uint)('\x03' < (p->vObjType).pArray[lVar5]));
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  printf("Primitives (%d):\n",uVar6);
  lVar2 = 0;
  do {
    if (pCounts[lVar2] != 0) {
      printf("%-20s = %5d\n",p->pDesign->pTypeNames[lVar2]);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x5a);
  lVar2 = (long)(p->vObjType).nSize;
  if (lVar2 < 1) {
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = (ulong)((int)uVar6 + (uint)((p->vObjType).pArray[lVar5] == '\x03'));
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  printf("User hierarchy (%d):\n",uVar6);
  pCVar4 = p->pDesign;
  if (1 < (pCVar4->vNtks).nSize) {
    lVar2 = 1;
    do {
      if (pUserCounts[lVar2] != 0) {
        plVar1 = (long *)(pCVar4->vNtks).pArray[lVar2];
        pcVar3 = Abc_NamStr(*(Abc_Nam_t **)(*plVar1 + 0x10),*(int *)((long)plVar1 + 0xc));
        printf("%-20s = %5d\n",pcVar3,(ulong)(uint)pUserCounts[lVar2]);
        pCVar4 = p->pDesign;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (pCVar4->vNtks).nSize);
  }
  return;
}

Assistant:

void Cba_NtkPrintDistribStat( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    Cba_Ntk_t * pNtk; int i;
    printf( "Primitives (%d):\n", Cba_NtkBoxPrimNum(p) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        if ( pCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkTypeName(p, i), pCounts[i] );
    printf( "User hierarchy (%d):\n", Cba_NtkBoxUserNum(p) );
    Cba_ManForEachNtk( p->pDesign, pNtk, i )
        if ( pUserCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkName(pNtk), pUserCounts[i] );
}